

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.h
# Opt level: O0

int32_t icu_63::CollationWeights::lengthOfWeight(uint32_t weight)

{
  undefined4 local_c;
  uint32_t weight_local;
  
  if ((weight & 0xffffff) == 0) {
    local_c = 1;
  }
  else if ((weight & 0xffff) == 0) {
    local_c = 2;
  }
  else if ((weight & 0xff) == 0) {
    local_c = 3;
  }
  else {
    local_c = 4;
  }
  return local_c;
}

Assistant:

static inline int32_t lengthOfWeight(uint32_t weight) {
        if((weight&0xffffff)==0) {
            return 1;
        } else if((weight&0xffff)==0) {
            return 2;
        } else if((weight&0xff)==0) {
            return 3;
        } else {
            return 4;
        }
    }